

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPointToArcTangents.cpp
# Opt level: O0

bool ParseTestPointToArcTangents(string *sString)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  syntax_option_type __f;
  int iVar5;
  value_type *pvVar6;
  char *__nptr;
  ostream *poVar7;
  string local_c70;
  double local_c50;
  double dLon_1;
  double local_c28;
  double dLat_1;
  double local_c00;
  double dLon;
  double local_bd8;
  double dLat;
  double dTol;
  undefined1 local_bc0 [8];
  string sTan2Lon;
  undefined1 local_b98 [8];
  string sTan2Lat;
  undefined1 local_b70 [8];
  string sTan1Lon;
  undefined1 local_b48 [8];
  string sTan1Lat;
  undefined1 auStack_b20 [4];
  int nIndex;
  LLPoint tanPt2;
  LLPoint tanPt1;
  string local_ae0;
  string local_ac0;
  string local_aa0;
  undefined1 local_a80 [8];
  LLPoint tangentPt2;
  LLPoint tangentPt1;
  double radius;
  string local_a38;
  undefined1 local_a18 [8];
  LLPoint arc;
  string local_9e8;
  undefined1 local_9c8 [8];
  LLPoint pt;
  regex_error *e;
  string_type local_920;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_900;
  string_type local_878;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_858;
  string_type local_7d0;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_7b0;
  string_type local_728;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_708;
  string_type local_680;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_660;
  string_type local_5d8;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_5b8;
  string_type local_530;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_510;
  string_type local_488;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_468;
  string_type local_3e0;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_3c0;
  string_type local_338;
  undefined1 local_318 [8];
  sregex_token_iterator s_end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  undefined1 local_270 [8];
  sregex_token_iterator it;
  int sub_matches [10];
  regex pat;
  undefined1 local_198 [8];
  string sRxPat;
  string local_160 [4];
  syntax_option_type flags;
  string sTanPt2Lon;
  string sTanPt2Lat;
  string sTanPt1Lon;
  string sTanPt1Lat;
  string sArcRadius;
  string sArcCenterLon;
  string sArcCenterLat;
  string sPointLon;
  string sPointLat;
  string sTestId;
  bool bPassed;
  string *sString_local;
  
  trim(sString," \t\n\r\f\v");
  std::__cxx11::string::string((string *)(sPointLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sPointLon.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sArcCenterLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sArcCenterLon.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sArcRadius.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sTanPt1Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sTanPt1Lon.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sTanPt2Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sTanPt2Lon.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_160);
  __f = std::regex_constants::operator|(1,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_198,"([a-zA-Z]*\\d*)[,]",
             (allocator *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::string::operator+=
            ((string *)local_198,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=
            ((string *)local_198,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=((string *)local_198,"([-+]?[0-9]*[.]?[0-9]+)[,]");
  std::__cxx11::string::operator+=
            ((string *)local_198,
             "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]"
            );
  std::__cxx11::string::operator+=
            ((string *)local_198,
             "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])"
            );
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)(sub_matches + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,__f);
  sub_matches[2] = 5;
  sub_matches[3] = 6;
  sub_matches[4] = 7;
  sub_matches[5] = 8;
  it._M_has_m1 = true;
  it._129_7_ = 0x2000000;
  sub_matches[0] = 3;
  sub_matches[1] = 4;
  sub_matches[6] = 9;
  sub_matches[7] = 10;
  local_280._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_278,&local_280);
  s_end._128_8_ = std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_288,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&s_end._M_has_m1);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<10ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)local_270,local_278,local_288,(regex_type *)(sub_matches + 8),
             (int (*) [10])&it._M_has_m1,0);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_318);
  sTestId.field_2._M_local_buf[0xf] =
       std::__cxx11::
       regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
       ::operator!=((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                     *)local_270,
                    (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                     *)local_318);
  if ((bool)sTestId.field_2._M_local_buf[0xf]) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3c0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_3c0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_338,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sPointLat.field_2._M_local_buf + 8),(string *)&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3c0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_468,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_468);
    std::__cxx11::sub_match::operator_cast_to_string(&local_3e0,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sPointLon.field_2._M_local_buf + 8),(string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_468);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_510,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_510);
    std::__cxx11::sub_match::operator_cast_to_string(&local_488,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sArcCenterLat.field_2._M_local_buf + 8),(string *)&local_488);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_510);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_5b8,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_5b8);
    std::__cxx11::sub_match::operator_cast_to_string(&local_530,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sArcCenterLon.field_2._M_local_buf + 8),(string *)&local_530);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_5b8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_660,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_660);
    std::__cxx11::sub_match::operator_cast_to_string(&local_5d8,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sArcRadius.field_2._M_local_buf + 8),(string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_660);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_708,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_708);
    std::__cxx11::sub_match::operator_cast_to_string(&local_680,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sTanPt1Lat.field_2._M_local_buf + 8),(string *)&local_680);
    std::__cxx11::string::~string((string *)&local_680);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_708);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_7b0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_7b0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_728,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sTanPt1Lon.field_2._M_local_buf + 8),(string *)&local_728);
    std::__cxx11::string::~string((string *)&local_728);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_7b0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_858,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_858);
    std::__cxx11::sub_match::operator_cast_to_string(&local_7d0,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sTanPt2Lat.field_2._M_local_buf + 8),(string *)&local_7d0);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_858);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_900,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_900);
    std::__cxx11::sub_match::operator_cast_to_string(&local_878,(sub_match *)pvVar6);
    std::__cxx11::string::operator=
              ((string *)(sTanPt2Lon.field_2._M_local_buf + 8),(string *)&local_878);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_900);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&e,(regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_270,0);
    pvVar6 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)&e);
    std::__cxx11::sub_match::operator_cast_to_string(&local_920,(sub_match *)pvVar6);
    std::__cxx11::string::operator=(local_160,(string *)&local_920);
    std::__cxx11::string::~string((string *)&local_920);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&e);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_318);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_270);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(sub_matches + 8));
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::string((string *)&local_9e8,(string *)(sPointLon.field_2._M_local_buf + 8));
  dVar1 = ParseLatitude(&local_9e8);
  dVar1 = Deg2Rad(dVar1);
  std::__cxx11::string::string
            ((string *)&arc.longitude,(string *)(sArcCenterLat.field_2._M_local_buf + 8));
  dVar2 = ParseLongitude((string *)&arc.longitude);
  dVar2 = Deg2Rad(dVar2);
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)local_9c8,dVar1,dVar2);
  std::__cxx11::string::~string((string *)&arc.longitude);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::string
            ((string *)&local_a38,(string *)(sArcCenterLon.field_2._M_local_buf + 8));
  dVar1 = ParseLatitude(&local_a38);
  dVar1 = Deg2Rad(dVar1);
  std::__cxx11::string::string((string *)&radius,(string *)(sArcRadius.field_2._M_local_buf + 8));
  dVar2 = ParseLongitude((string *)&radius);
  dVar2 = Deg2Rad(dVar2);
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)local_a18,dVar1,dVar2);
  std::__cxx11::string::~string((string *)&radius);
  std::__cxx11::string::~string((string *)&local_a38);
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(__nptr);
  dVar1 = NmToMeters(dVar1);
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)&tangentPt2.longitude);
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)local_a80);
  iVar5 = std::__cxx11::string::compare(sTanPt1Lon.field_2._M_local_buf + 8);
  if (iVar5 != 0) {
    std::__cxx11::string::string
              ((string *)&local_aa0,(string *)(sTanPt1Lon.field_2._M_local_buf + 8));
    dVar2 = ParseLatitude(&local_aa0);
    dVar2 = Deg2Rad(dVar2);
    std::__cxx11::string::string
              ((string *)&local_ac0,(string *)(sTanPt2Lat.field_2._M_local_buf + 8));
    dVar3 = ParseLongitude(&local_ac0);
    dVar3 = Deg2Rad(dVar3);
    GeoCalcs::LLPOINT::Set((LLPOINT *)&tangentPt2.longitude,dVar2,dVar3);
    std::__cxx11::string::~string((string *)&local_ac0);
    std::__cxx11::string::~string((string *)&local_aa0);
    std::__cxx11::string::string
              ((string *)&local_ae0,(string *)(sTanPt2Lon.field_2._M_local_buf + 8));
    dVar2 = ParseLatitude(&local_ae0);
    dVar2 = Deg2Rad(dVar2);
    std::__cxx11::string::string((string *)&tanPt1.longitude,local_160);
    dVar3 = ParseLongitude((string *)&tanPt1.longitude);
    dVar3 = Deg2Rad(dVar3);
    GeoCalcs::LLPOINT::Set((LLPOINT *)local_a80,dVar2,dVar3);
    std::__cxx11::string::~string((string *)&tanPt1.longitude);
    std::__cxx11::string::~string((string *)&local_ae0);
  }
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)&tanPt2.longitude);
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)auStack_b20);
  sTan1Lat.field_2._12_4_ =
       GeoCalcs::PointToArcTangents
                 ((LLPoint *)local_9c8,(LLPoint *)local_a18,dVar1,(LLPoint *)&tanPt2.longitude,
                  (LLPoint *)auStack_b20,1e-08);
  if (sTan1Lat.field_2._12_4_ == 0) {
    iVar5 = std::__cxx11::string::compare(sTanPt1Lon.field_2._M_local_buf + 8);
    if (iVar5 != 0) {
      sTestId.field_2._M_local_buf[0xf] = '\0';
      poVar7 = std::operator<<((ostream *)&std::cout,"\n");
      poVar7 = std::operator<<(poVar7,(string *)(sPointLat.field_2._M_local_buf + 8));
      std::operator<<(poVar7," Failed: Returned with no solution.");
    }
  }
  else {
    sTan1Lon.field_2._8_8_ = Rad2Deg(tanPt2.longitude);
    ConvertLatitudeDdToDms_abi_cxx11_((string *)local_b48,(double *)((long)&sTan1Lon.field_2 + 8));
    sTan2Lat.field_2._8_8_ = Rad2Deg(tanPt1.latitude);
    ConvertLongitudeDdToDms_abi_cxx11_((string *)local_b70,(double *)((long)&sTan2Lat.field_2 + 8));
    sTan2Lon.field_2._8_8_ = Rad2Deg(_auStack_b20);
    ConvertLatitudeDdToDms_abi_cxx11_((string *)local_b98,(double *)((long)&sTan2Lon.field_2 + 8));
    dTol = Rad2Deg(tanPt2.latitude);
    ConvertLongitudeDdToDms_abi_cxx11_((string *)local_bc0,&dTol);
    dLat = 1e-10;
    iVar5 = std::__cxx11::string::compare((string *)local_b48);
    if (iVar5 != 0) {
      std::__cxx11::string::string((string *)&dLon,(string *)(sTanPt1Lon.field_2._M_local_buf + 8));
      dVar1 = ParseLatitude((string *)&dLon);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::~string((string *)&dLon);
      local_bd8 = dVar1;
      bVar4 = IsApprox(dVar1,tanPt2.longitude,dLat);
      if (bVar4) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n");
        poVar7 = std::operator<<(poVar7,(string *)(sPointLat.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7," within rounding tolerance of ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,dLat);
        poVar7 = std::operator<<(poVar7,": Input Tangent pt 1 latitude: ");
        poVar7 = std::operator<<(poVar7,(string *)(sTanPt1Lon.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7,"  calced: ");
        std::operator<<(poVar7,(string *)local_b48);
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n");
        poVar7 = std::operator<<(poVar7,(string *)(sPointLat.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7," failed: Expected Tangent pt 1 latitude: ");
        poVar7 = std::operator<<(poVar7,(string *)(sTanPt1Lon.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7,"  calced: ");
        std::operator<<(poVar7,(string *)local_b48);
        sTestId.field_2._M_local_buf[0xf] = '\0';
      }
    }
    iVar5 = std::__cxx11::string::compare((string *)local_b70);
    if (iVar5 != 0) {
      std::__cxx11::string::string
                ((string *)&dLat_1,(string *)(sTanPt2Lat.field_2._M_local_buf + 8));
      dVar1 = ParseLongitude((string *)&dLat_1);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::~string((string *)&dLat_1);
      local_c00 = dVar1;
      bVar4 = IsApprox(dVar1,tanPt1.latitude,dLat);
      if (bVar4) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n");
        poVar7 = std::operator<<(poVar7,(string *)(sPointLat.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7," within rounding tolerance of ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,dLat);
        poVar7 = std::operator<<(poVar7,": Input Tangent pt 1 longitude: ");
        poVar7 = std::operator<<(poVar7,(string *)(sTanPt2Lat.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7,"  calced: ");
        std::operator<<(poVar7,(string *)local_b70);
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n");
        poVar7 = std::operator<<(poVar7,(string *)(sPointLat.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7," failed: Expected Tangent pt 1 longitude: ");
        poVar7 = std::operator<<(poVar7,(string *)(sTanPt2Lat.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7,"  calced: ");
        std::operator<<(poVar7,(string *)local_b70);
        sTestId.field_2._M_local_buf[0xf] = '\0';
      }
    }
    iVar5 = std::__cxx11::string::compare((string *)local_b98);
    if (iVar5 != 0) {
      std::__cxx11::string::string
                ((string *)&dLon_1,(string *)(sTanPt2Lon.field_2._M_local_buf + 8));
      dVar1 = ParseLatitude((string *)&dLon_1);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::~string((string *)&dLon_1);
      local_c28 = dVar1;
      bVar4 = IsApprox(dVar1,_auStack_b20,dLat);
      if (bVar4) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n");
        poVar7 = std::operator<<(poVar7,(string *)(sPointLat.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7," within rounding tolerance of ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,dLat);
        poVar7 = std::operator<<(poVar7,": Input Tangent pt 2 latitude: ");
        poVar7 = std::operator<<(poVar7,(string *)(sTanPt2Lon.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7,"  calced: ");
        std::operator<<(poVar7,(string *)local_b98);
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n");
        poVar7 = std::operator<<(poVar7,(string *)(sPointLat.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7," failed: Expected Tangent pt 2 latitude: ");
        poVar7 = std::operator<<(poVar7,(string *)(sTanPt2Lon.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7,"  calced: ");
        std::operator<<(poVar7,(string *)local_b98);
        sTestId.field_2._M_local_buf[0xf] = '\0';
      }
    }
    iVar5 = std::__cxx11::string::compare((string *)local_bc0);
    if (iVar5 != 0) {
      std::__cxx11::string::string((string *)&local_c70,local_160);
      dVar1 = ParseLongitude(&local_c70);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::~string((string *)&local_c70);
      local_c50 = dVar1;
      bVar4 = IsApprox(dVar1,tanPt2.latitude,dLat);
      if (bVar4) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n");
        poVar7 = std::operator<<(poVar7,(string *)(sPointLat.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7," within rounding tolerance of ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,dLat);
        poVar7 = std::operator<<(poVar7,": Input Tangent pt 2 longitude: ");
        poVar7 = std::operator<<(poVar7,local_160);
        poVar7 = std::operator<<(poVar7,"  calced: ");
        std::operator<<(poVar7,(string *)local_bc0);
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n");
        poVar7 = std::operator<<(poVar7,(string *)(sPointLat.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7," failed: Expected Tangent pt 2 longitude: ");
        poVar7 = std::operator<<(poVar7,local_160);
        poVar7 = std::operator<<(poVar7,"  calced: ");
        std::operator<<(poVar7,(string *)local_bc0);
        sTestId.field_2._M_local_buf[0xf] = '\0';
      }
    }
    std::__cxx11::string::~string((string *)local_bc0);
    std::__cxx11::string::~string((string *)local_b98);
    std::__cxx11::string::~string((string *)local_b70);
    std::__cxx11::string::~string((string *)local_b48);
  }
  pt.longitude._4_4_ = 1;
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string((string *)(sTanPt2Lon.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sTanPt2Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sTanPt1Lon.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sTanPt1Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sArcRadius.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sArcCenterLon.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sArcCenterLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sPointLon.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sPointLat.field_2._M_local_buf + 8));
  return (bool)sTestId.field_2._M_local_buf[0xf];
}

Assistant:

bool ParseTestPointToArcTangents(string sString)
{
    bool bPassed = false;
    trim(sString);
    string sTestId, sPointLat, sPointLon, sArcCenterLat, sArcCenterLon, sArcRadius;
    string sTanPt1Lat, sTanPt1Lon, sTanPt2Lat, sTanPt2Lon;
    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-zA-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])";

        regex pat(sRxPat, flags);

        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            sTestId = *it++;
            sPointLat = *it++;
            sPointLon = *it++;
            sArcCenterLat = *it++;
            sArcCenterLon = *it++;
            sArcRadius = *it++;
            sTanPt1Lat = *it++;
            sTanPt1Lon = *it++;
            sTanPt2Lat = *it++;
            sTanPt2Lon = *it++;
            bPassed = true;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }

    LLPoint pt(Deg2Rad(ParseLatitude(sPointLat)), Deg2Rad(ParseLongitude(sPointLon)));
    LLPoint arc(Deg2Rad(ParseLatitude(sArcCenterLat)), Deg2Rad(ParseLongitude(sArcCenterLon)));
    double radius = NmToMeters(atof(sArcRadius.c_str()));

    LLPoint tangentPt1;
    LLPoint tangentPt2;

    if (sTanPt1Lat.compare("N/A") != 0)
    {
        tangentPt1.Set(Deg2Rad(ParseLatitude(sTanPt1Lat)), Deg2Rad(ParseLongitude(sTanPt1Lon)));
        tangentPt2.Set(Deg2Rad(ParseLatitude(sTanPt2Lat)), Deg2Rad(ParseLongitude(sTanPt2Lon)));
    }

    LLPoint tanPt1, tanPt2;

    int nIndex = PointToArcTangents(pt, arc, radius, tanPt1, tanPt2, 1e-8);

    if (nIndex == 0)
    {
        if (sTanPt1Lat.compare("N/A") != 0)
        {
            bPassed = false;
            cout << "\n" << sTestId << " Failed: Returned with no solution.";
        }

    }
    else
    {

        string sTan1Lat = ConvertLatitudeDdToDms(Rad2Deg(tanPt1.latitude));
        string sTan1Lon = ConvertLongitudeDdToDms(Rad2Deg(tanPt1.longitude));
        string sTan2Lat = ConvertLatitudeDdToDms(Rad2Deg(tanPt2.latitude));
        string sTan2Lon = ConvertLongitudeDdToDms(Rad2Deg(tanPt2.longitude));

        double dTol = 1e-10;
        if (sTan1Lat.compare(sTanPt1Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sTanPt1Lat));
            if (IsApprox(dLat, tanPt1.latitude, dTol))
            {
                cout << "\n" << sTestId << " within rounding tolerance of " << dTol <<
                ": Input Tangent pt 1 latitude: " << sTanPt1Lat << "  calced: " << sTan1Lat;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tangent pt 1 latitude: " << sTanPt1Lat << "  calced: " <<
                sTan1Lat;
                bPassed = false;
            }
        }

        if (sTan1Lon.compare(sTanPt1Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sTanPt1Lon));
            if (IsApprox(dLon, tanPt1.longitude, dTol))
            {
                cout << "\n" << sTestId << " within rounding tolerance of " << dTol <<
                ": Input Tangent pt 1 longitude: " << sTanPt1Lon << "  calced: " << sTan1Lon;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tangent pt 1 longitude: " << sTanPt1Lon << "  calced: " <<
                sTan1Lon;
                bPassed = false;
            }
        }

        if (sTan2Lat.compare(sTanPt2Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sTanPt2Lat));
            if (IsApprox(dLat, tanPt2.latitude, dTol))
            {
                cout << "\n" << sTestId << " within rounding tolerance of " << dTol <<
                ": Input Tangent pt 2 latitude: " << sTanPt2Lat << "  calced: " << sTan2Lat;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tangent pt 2 latitude: " << sTanPt2Lat << "  calced: " <<
                sTan2Lat;
                bPassed = false;
            }
        }

        if (sTan2Lon.compare(sTanPt2Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sTanPt2Lon));
            if (IsApprox(dLon, tanPt2.longitude, dTol))
            {
                cout << "\n" << sTestId << " within rounding tolerance of " << dTol <<
                ": Input Tangent pt 2 longitude: " << sTanPt2Lon << "  calced: " << sTan2Lon;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tangent pt 2 longitude: " << sTanPt2Lon << "  calced: " <<
                sTan2Lon;
                bPassed = false;
            }
        }


    }


    return bPassed;
}